

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::BufferGLImpl::BufferGLImpl
          (BufferGLImpl *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *BuffViewObjMemAllocator,RenderDeviceGLImpl *pDeviceGL,
          BufferDesc *BuffDesc,GLContextState *CtxState,GLuint GLHandle,bool bIsDeviceInternal)

{
  GLenum GVar1;
  GLBufferObjCreateReleaseHelper local_9c;
  Char *local_98;
  Uint64 UStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Uint64 local_78;
  BufferDesc local_68;
  byte local_39;
  GLContextState *pGStack_38;
  bool bIsDeviceInternal_local;
  GLContextState *CtxState_local;
  BufferDesc *BuffDesc_local;
  RenderDeviceGLImpl *pDeviceGL_local;
  FixedBlockMemoryAllocator *BuffViewObjMemAllocator_local;
  IReferenceCounters *pRefCounters_local;
  BufferGLImpl *this_local;
  
  local_39 = bIsDeviceInternal;
  local_78 = BuffDesc->ImmediateContextMask;
  local_98 = (BuffDesc->super_DeviceObjectAttribs).Name;
  UStack_90 = BuffDesc->Size;
  local_88._0_4_ = BuffDesc->BindFlags;
  local_88._4_1_ = BuffDesc->Usage;
  local_88._5_1_ = BuffDesc->CPUAccessFlags;
  local_88._6_1_ = BuffDesc->Mode;
  local_88._7_1_ = BuffDesc->MiscFlags;
  uStack_80 = *(undefined8 *)&BuffDesc->ElementByteStride;
  pGStack_38 = CtxState;
  CtxState_local = (GLContextState *)BuffDesc;
  BuffDesc_local = (BufferDesc *)pDeviceGL;
  pDeviceGL_local = (RenderDeviceGLImpl *)BuffViewObjMemAllocator;
  BuffViewObjMemAllocator_local = (FixedBlockMemoryAllocator *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  GetBufferDescFromGLHandle(&local_68,CtxState,*BuffDesc,GLHandle);
  BufferBase<Diligent::EngineGLImplTraits>::BufferBase
            (&this->super_BufferBase<Diligent::EngineGLImplTraits>,pRefCounters,
             BuffViewObjMemAllocator,pDeviceGL,&local_68,(bool)(local_39 & 1));
  AsyncWritableResource::AsyncWritableResource(&this->super_AsyncWritableResource);
  (this->super_BufferBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>.
  super_ObjectBase<Diligent::IBufferGL>.super_RefCountedObject<Diligent::IBufferGL>.super_IBufferGL.
  super_IBuffer.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_0058d010;
  GLObjectWrappers::GLBufferObjCreateReleaseHelper::GLBufferObjCreateReleaseHelper
            (&local_9c,GLHandle);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::GLObjWrapper
            (&this->m_GlBuffer,true,local_9c);
  GVar1 = GetBufferBindTarget(&(this->super_BufferBase<Diligent::EngineGLImplTraits>).
                               super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                               .m_Desc);
  this->m_BindTarget = GVar1;
  GVar1 = UsageToGLUsage((BufferDesc *)CtxState_local);
  this->m_GLUsageHint = GVar1;
  (this->super_BufferBase<Diligent::EngineGLImplTraits>).m_MemoryProperties =
       MEMORY_PROPERTY_HOST_COHERENT;
  return;
}

Assistant:

BufferGLImpl::BufferGLImpl(IReferenceCounters*        pRefCounters,
                           FixedBlockMemoryAllocator& BuffViewObjMemAllocator,
                           RenderDeviceGLImpl*        pDeviceGL,
                           const BufferDesc&          BuffDesc,
                           GLContextState&            CtxState,
                           GLuint                     GLHandle,
                           bool                       bIsDeviceInternal) :
    // clang-format off
    TBufferBase
    {
        pRefCounters,
        BuffViewObjMemAllocator,
        pDeviceGL,
        GetBufferDescFromGLHandle(CtxState, BuffDesc, GLHandle),
        bIsDeviceInternal
    },
    // Attach to external buffer handle
    m_GlBuffer    {true, GLObjectWrappers::GLBufferObjCreateReleaseHelper(GLHandle)},
    m_BindTarget  {GetBufferBindTarget(m_Desc)},
    m_GLUsageHint {UsageToGLUsage(BuffDesc)   }
// clang-format on
{
    m_MemoryProperties = MEMORY_PROPERTY_HOST_COHERENT;
}